

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O1

void brotli::ClusterBlocks<brotli::Histogram<256>,unsigned_char>
               (uchar *data,size_t length,uint8_t *block_ids)

{
  uint8_t uVar1;
  uint8_t uVar2;
  pointer pHVar3;
  uint uVar4;
  size_t sVar5;
  vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> histograms;
  vector<unsigned_int,_std::allocator<unsigned_int>_> block_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_symbols;
  vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> clustered_histograms;
  Histogram<256> cur_histogram;
  vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> local_4b8;
  uchar *local_498;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_490;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_478;
  size_t local_460;
  vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> local_458;
  Histogram<256> local_440;
  
  local_4b8.super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Histogram<256> *)0x0;
  local_4b8.super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Histogram<256> *)0x0;
  local_498 = data;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_490,length,(allocator_type *)&local_440);
  uVar4 = 0;
  memset(&local_440,0,0x408);
  local_440.bit_cost_ = INFINITY;
  if (length != 0) {
    local_460 = length - 1;
    sVar5 = 0;
    do {
      pHVar3 = local_4b8.
               super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (local_460 == sVar5) {
        local_490.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar5] = uVar4;
        local_440.data_[local_498[sVar5]] = local_440.data_[local_498[sVar5]] + 1;
        local_440.total_count_ = local_440.total_count_ + 1;
LAB_00172076:
        if (local_4b8.
            super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_4b8.
            super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<brotli::Histogram<256>,std::allocator<brotli::Histogram<256>>>::
          _M_realloc_insert<brotli::Histogram<256>const&>
                    ((vector<brotli::Histogram<256>,std::allocator<brotli::Histogram<256>>> *)
                     &local_4b8,
                     (iterator)
                     local_4b8.
                     super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_440);
        }
        else {
          memcpy(local_4b8.
                 super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_440,0x410);
          local_4b8.
          super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = pHVar3 + 1;
        }
        memset(&local_440,0,0x408);
        local_440.bit_cost_ = INFINITY;
        uVar4 = uVar4 + 1;
      }
      else {
        uVar1 = block_ids[sVar5];
        uVar2 = block_ids[sVar5 + 1];
        local_490.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar5] = uVar4;
        local_440.data_[local_498[sVar5]] = local_440.data_[local_498[sVar5]] + 1;
        local_440.total_count_ = local_440.total_count_ + 1;
        if (uVar1 != uVar2) goto LAB_00172076;
      }
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  local_458.super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ClusterHistograms<brotli::Histogram<256>>
            (&local_4b8,1,
             ((long)local_4b8.
                    super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_4b8.
                    super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0xfc0fc0fc0fc0fc1,0x100,
             &local_458,&local_478);
  if (length != 0) {
    sVar5 = 0;
    do {
      block_ids[sVar5] =
           (uint8_t)local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [local_490.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar5]];
      sVar5 = sVar5 + 1;
    } while (length != sVar5);
  }
  if (local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_478.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_458.super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.
                    super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_458.
                          super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_458.
                          super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_490.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_490.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_490.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_490.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4b8.super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b8.
                    super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b8.
                          super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b8.
                          super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ClusterBlocks(const DataType* data, const size_t length,
                   uint8_t* block_ids) {
  std::vector<HistogramType> histograms;
  std::vector<uint32_t> block_index(length);
  uint32_t cur_idx = 0;
  HistogramType cur_histogram;
  for (size_t i = 0; i < length; ++i) {
    bool block_boundary = (i + 1 == length || block_ids[i] != block_ids[i + 1]);
    block_index[i] = cur_idx;
    cur_histogram.Add(data[i]);
    if (block_boundary) {
      histograms.push_back(cur_histogram);
      cur_histogram.Clear();
      ++cur_idx;
    }
  }
  std::vector<HistogramType> clustered_histograms;
  std::vector<uint32_t> histogram_symbols;
  // Block ids need to fit in one byte.
  static const size_t kMaxNumberOfBlockTypes = 256;
  ClusterHistograms(histograms, 1, histograms.size(),
                    kMaxNumberOfBlockTypes,
                    &clustered_histograms,
                    &histogram_symbols);
  for (size_t i = 0; i < length; ++i) {
    block_ids[i] = static_cast<uint8_t>(histogram_symbols[block_index[i]]);
  }
}